

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::interpolate_at_centroid
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  bool bVar1;
  ContextType ctxType;
  char *__s;
  long *plVar2;
  NotSupportedError *this;
  size_type *psVar3;
  long lVar4;
  long lVar5;
  string shaderSource;
  _Alloc_hider _Var6;
  size_type sVar7;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffee0;
  allocator<char> local_111;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_OES_shader_multisample_interpolation","");
    bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_OES_shader_multisample_interpolation\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0xff7);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  _Var6._M_p = &stack0xfffffffffffffed8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffec8,"interpolateAtCentroid","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffec8);
  if (_Var6._M_p != &stack0xfffffffffffffed8) {
    operator_delete(_Var6._M_p,in_stack_fffffffffffffed8 + 1);
  }
  lVar5 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar5);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_111);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1c82f43);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        uVar8 = *psVar3;
        in_stack_fffffffffffffee0 = plVar2[3];
        _Var6._M_p = &stack0xfffffffffffffed8;
      }
      else {
        uVar8 = *psVar3;
        _Var6._M_p = (pointer)*plVar2;
      }
      sVar7 = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffec8);
      if (_Var6._M_p != &stack0xfffffffffffffed8) {
        operator_delete(_Var6._M_p,uVar8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (lVar5 == 4) {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  ((string *)&stack0xfffffffffffffec8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x18,SHADER_FUNCTION_LAST,TYPE_LAST,
                   (DataType)_Var6._M_p);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char*>((string *)local_90,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_00._M_string_length = sVar7;
        shaderSource_00._M_dataplus._M_p = _Var6._M_p;
        shaderSource_00.field_2._M_allocated_capacity = uVar8;
        shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffee0;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_90[0],shaderSource_00);
        lVar4 = local_80[0];
        plVar2 = local_90[0];
        if (local_90[0] != local_80) {
LAB_01611e81:
          operator_delete(plVar2,lVar4 + 1);
        }
      }
      else {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  ((string *)&stack0xfffffffffffffec8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x18,SHADER_FUNCTION_BIT_COUNT,TYPE_LAST
                   ,(DataType)_Var6._M_p);
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>((string *)local_b0,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_01._M_string_length = sVar7;
        shaderSource_01._M_dataplus._M_p = _Var6._M_p;
        shaderSource_01.field_2._M_allocated_capacity = uVar8;
        shaderSource_01.field_2._8_8_ = in_stack_fffffffffffffee0;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b0[0],shaderSource_01);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffed8) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  ((string *)&stack0xfffffffffffffec8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x18,SHADER_FUNCTION_FIND_MSB,TYPE_LAST,
                   (DataType)_Var6._M_p);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>((string *)local_d0,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_02._M_string_length = sVar7;
        shaderSource_02._M_dataplus._M_p = _Var6._M_p;
        shaderSource_02.field_2._M_allocated_capacity = uVar8;
        shaderSource_02.field_2._8_8_ = in_stack_fffffffffffffee0;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_d0[0],shaderSource_02);
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffed8) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  ((string *)&stack0xfffffffffffffec8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x18,SHADER_FUNCTION_FIND_LSB,TYPE_LAST,
                   (DataType)_Var6._M_p);
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>((string *)local_f0,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_03._M_string_length = sVar7;
        shaderSource_03._M_dataplus._M_p = _Var6._M_p;
        shaderSource_03.field_2._M_allocated_capacity = uVar8;
        shaderSource_03.field_2._8_8_ = in_stack_fffffffffffffee0;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_f0[0],shaderSource_03);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffed8) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  ((string *)&stack0xfffffffffffffec8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x18,SHADER_FUNCTION_UADD_CARRY,
                   TYPE_LAST,(DataType)_Var6._M_p);
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char*>((string *)local_110,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_04._M_string_length = sVar7;
        shaderSource_04._M_dataplus._M_p = _Var6._M_p;
        shaderSource_04.field_2._M_allocated_capacity = uVar8;
        shaderSource_04.field_2._8_8_ = in_stack_fffffffffffffee0;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_110[0],shaderSource_04);
        lVar4 = local_100[0];
        plVar2 = local_110[0];
        if (local_110[0] != local_100) goto LAB_01611e81;
      }
      if (_Var6._M_p != &stack0xfffffffffffffed8) {
        operator_delete(_Var6._M_p,uVar8 + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar5 = lVar5 + 4;
    if (lVar5 == 0x18) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void interpolate_at_centroid (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_OES_shader_multisample_interpolation"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("interpolateAtCentroid");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_FRAGMENT)
			{
				const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			else
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC2));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC3));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC4));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}